

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawSprite
          (PixelGameEngine *this,int32_t x,int32_t y,Sprite *sprite,uint32_t scale,uint8_t flip)

{
  int iVar1;
  Pixel PVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int x_00;
  uint32_t js;
  uint32_t uVar7;
  int32_t iVar8;
  int local_78;
  int local_74;
  int local_70;
  
  if (sprite != (Sprite *)0x0) {
    local_78 = 0;
    iVar1 = 1;
    local_74 = 1;
    x_00 = 0;
    if ((flip & 1) != 0) {
      x_00 = sprite->width + -1;
      local_74 = -1;
    }
    if ((flip & 2) != 0) {
      local_78 = sprite->height + -1;
      iVar1 = -1;
    }
    if (scale < 2) {
      if (0 < sprite->width) {
        iVar4 = 0;
        do {
          if (0 < sprite->height) {
            iVar5 = 0;
            iVar3 = local_78;
            do {
              PVar2 = Sprite::GetPixel(sprite,x_00,iVar3);
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(uint)(x + iVar4),(ulong)(uint)(y + iVar5),
                         (ulong)(uint)PVar2.field_0);
              iVar5 = iVar5 + 1;
              iVar3 = iVar3 + iVar1;
            } while (iVar5 < sprite->height);
          }
          iVar4 = iVar4 + 1;
          x_00 = x_00 + local_74;
        } while (iVar4 < sprite->width);
      }
    }
    else if (0 < sprite->width) {
      local_70 = 0;
      do {
        if (0 < sprite->height) {
          iVar3 = 0;
          iVar4 = local_78;
          iVar8 = y;
          do {
            uVar6 = 0;
            do {
              uVar7 = 0;
              do {
                PVar2 = Sprite::GetPixel(sprite,x_00,iVar4);
                (*this->_vptr_PixelGameEngine[5])
                          (this,(ulong)(local_70 * scale + x + uVar6),(ulong)(iVar8 + uVar7),
                           (ulong)(uint)PVar2.field_0);
                uVar7 = uVar7 + 1;
              } while (scale != uVar7);
              uVar6 = uVar6 + 1;
            } while (uVar6 != scale);
            iVar3 = iVar3 + 1;
            iVar4 = iVar4 + iVar1;
            iVar8 = iVar8 + scale;
          } while (iVar3 < sprite->height);
        }
        local_70 = local_70 + 1;
        x_00 = x_00 + local_74;
      } while (local_70 < sprite->width);
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawSprite(int32_t x, int32_t y, Sprite *sprite, uint32_t scale, uint8_t flip)
	{
		if (sprite == nullptr)
			return;

		int32_t fxs = 0, fxm = 1, fx = 0;
		int32_t fys = 0, fym = 1, fy = 0;
		if (flip & olc::Sprite::Flip::HORIZ)
		{
			fxs = sprite->width - 1;
			fxm = -1;
		}
		if (flip & olc::Sprite::Flip::VERT)
		{
			fys = sprite->height - 1;
			fym = -1;
		}

		if (scale > 1)
		{
			fx = fxs;
			for (int32_t i = 0; i < sprite->width; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < sprite->height; j++, fy += fym)
					for (uint32_t is = 0; is < scale; is++)
						for (uint32_t js = 0; js < scale; js++)
							Draw(x + (i * scale) + is, y + (j * scale) + js, sprite->GetPixel(fx, fy));
			}
		}
		else
		{
			fx = fxs;
			for (int32_t i = 0; i < sprite->width; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < sprite->height; j++, fy += fym)
					Draw(x + i, y + j, sprite->GetPixel(fx, fy));
			}
		}
	}